

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O0

void ppRedPentanomial(word *a,pp_pentanom_st *p)

{
  ulong uVar1;
  sbyte sVar2;
  sbyte sVar3;
  sbyte sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  sbyte sVar13;
  long lVar14;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  size_t n;
  size_t kw;
  size_t kb;
  size_t lw;
  size_t lb;
  size_t l1w;
  size_t l1b;
  size_t mw;
  size_t mb;
  word hi;
  pp_pentanom_st *p_local;
  word *a_local;
  
  uVar5 = p->m & 0x3f;
  uVar6 = p->m >> 6;
  uVar7 = p->m - p->l1 & 0x3f;
  uVar8 = p->m - p->l1 >> 6;
  uVar9 = p->m - p->l & 0x3f;
  uVar10 = p->m - p->l >> 6;
  uVar11 = p->m - p->k & 0x3f;
  uVar12 = p->m - p->k >> 6;
  n = (p->m + 0x3f >> 6) << 1;
  while (n = n - 1, sVar13 = (sbyte)uVar5, sVar2 = (sbyte)uVar7, sVar3 = (sbyte)uVar9,
        sVar4 = (sbyte)uVar11, uVar6 < n) {
    uVar1 = a[n];
    if (uVar5 == 0) {
      local_68 = 0;
    }
    else {
      local_68 = uVar1 << (0x40U - sVar13 & 0x3f);
    }
    lVar14 = (n - uVar6) + -1;
    a[lVar14] = local_68 ^ a[lVar14];
    a[n - uVar6] = uVar1 >> sVar13 ^ a[n - uVar6];
    if (uVar7 == 0) {
      local_70 = 0;
    }
    else {
      local_70 = uVar1 << (0x40U - sVar2 & 0x3f);
    }
    lVar14 = (n - uVar8) + -1;
    a[lVar14] = local_70 ^ a[lVar14];
    a[n - uVar8] = uVar1 >> sVar2 ^ a[n - uVar8];
    if (uVar9 == 0) {
      local_78 = 0;
    }
    else {
      local_78 = uVar1 << (0x40U - sVar3 & 0x3f);
    }
    lVar14 = (n - uVar10) + -1;
    a[lVar14] = local_78 ^ a[lVar14];
    a[n - uVar10] = uVar1 >> sVar3 ^ a[n - uVar10];
    if (uVar11 == 0) {
      local_80 = 0;
    }
    else {
      local_80 = uVar1 << (0x40U - sVar4 & 0x3f);
    }
    lVar14 = (n - uVar12) + -1;
    a[lVar14] = local_80 ^ a[lVar14];
    a[n - uVar12] = uVar1 >> sVar4 ^ a[n - uVar12];
  }
  uVar5 = a[n];
  *a = uVar5 >> sVar13 ^ *a;
  uVar5 = (uVar5 >> sVar13) << sVar13;
  if ((uVar8 < n) && (uVar7 != 0)) {
    lVar14 = (n - uVar8) + -1;
    a[lVar14] = uVar5 << (0x40U - sVar2 & 0x3f) ^ a[lVar14];
  }
  a[n - uVar8] = uVar5 >> sVar2 ^ a[n - uVar8];
  if ((uVar10 < n) && (uVar9 != 0)) {
    lVar14 = (n - uVar10) + -1;
    a[lVar14] = uVar5 << (0x40U - sVar3 & 0x3f) ^ a[lVar14];
  }
  a[n - uVar10] = uVar5 >> sVar3 ^ a[n - uVar10];
  if ((uVar12 < n) && (uVar11 != 0)) {
    lVar14 = (n - uVar12) + -1;
    a[lVar14] = uVar5 << (0x40U - sVar4 & 0x3f) ^ a[lVar14];
  }
  a[n - uVar12] = uVar5 >> sVar4 ^ a[n - uVar12];
  a[n] = uVar5 ^ a[n];
  return;
}

Assistant:

void ppRedPentanomial(word a[], const pp_pentanom_st* p)
{
	register word hi;
	size_t mb, mw, l1b, l1w, lb, lw, kb, kw;
	size_t n;
	// pre
	ASSERT(memIsValid(p, sizeof(pp_pentanom_st)));
	ASSERT(wwIsValid(a, 2 * W_OF_B(p->m)));
	ASSERT(p->m > p->k && p->k > p->l && p->l > p->l1 && p->l1 > 0);
	ASSERT(p->k < B_PER_W);
	ASSERT(p->m - p->k >= B_PER_W);
	// разбор пятичлена
	mb = p->m % B_PER_W;
	mw = p->m / B_PER_W;
	l1b = (p->m - p->l1) % B_PER_W;
	l1w = (p->m - p->l1) / B_PER_W;
	lb = (p->m - p->l) % B_PER_W;
	lw = (p->m - p->l) / B_PER_W;
	kb = (p->m - p->k) % B_PER_W;
	kw = (p->m - p->k) / B_PER_W;
	// обрабатываем старшие слова
	for (n = 2 * W_OF_B(p->m); --n > mw;)
	{
		hi = a[n];
		a[n - mw - 1] ^= mb ? hi << (B_PER_W - mb) : 0;
		a[n - mw] ^= hi >> mb;
		a[n - l1w - 1] ^= l1b ? hi << (B_PER_W - l1b) : 0;
		a[n - l1w] ^= hi >> l1b;
		a[n - lw - 1] ^= lb ? hi << (B_PER_W - lb) : 0;
		a[n - lw] ^= hi >> lb;
		a[n - kw - 1] ^= kb ? hi << (B_PER_W - kb) : 0;
		a[n - kw] ^= hi >> kb;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == mw);
	hi = a[n] >> mb;
	a[0] ^= hi;
	hi <<= mb;
	if (l1w < n && l1b)
		a[n - l1w - 1] ^= hi << (B_PER_W - l1b);
	a[n - l1w] ^= hi >> l1b;
	if (lw < n && lb)
		a[n - lw - 1] ^= hi << (B_PER_W - lb);
	a[n - lw] ^= hi >> lb;
	if (kw < n && kb)
		a[n - kw - 1] ^= hi << (B_PER_W - kb);
	a[n - kw] ^= hi >> kb;
	a[n] ^= hi;
	// очистка
	hi = 0;
}